

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
          (MessageCreator *this,MessageLite *prototype_for_func,MessageLite *prototype_for_copy,
          void *mem,Arena *arena)

{
  char *pcVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Tag TVar5;
  uint uVar6;
  intptr_t iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  MessageLite *pMVar18;
  ulong uVar19;
  Arena *unaff_RBX;
  ulong uVar20;
  MessageCreator *unaff_R13;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  MessageLite local_40;
  
  if ((ulong)mem % (ulong)this->alignment_ == 0) {
    TVar5 = this->tag_;
    if (TVar5 < kZeroInit) goto LAB_002ca14d;
    uVar6 = this->allocation_size_;
    uVar20 = (ulong)uVar6;
    if (TVar5 == kZeroInit) {
      pcVar1 = (char *)((long)&prototype_for_copy->_vptr_MessageLite + uVar20);
      pcVar15 = std::
                __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>(google::protobuf::MessageLite_const*,google::protobuf::MessageLite_const*,void*,google::protobuf::Arena*)const::_lambda(auto:1)_1_>>
                          (prototype_for_copy + 1,pcVar1);
      if (pcVar15 != pcVar1) {
LAB_002ca174:
        PlacementNew<false,google::protobuf::MessageLite>();
      }
      if (uVar6 < 0x21) {
        uVar21 = 0;
        uVar22 = 0;
        uVar23 = 0;
        uVar24 = 0;
LAB_002c9fbf:
        puVar2 = (undefined4 *)((long)mem + (uVar20 - 0x10));
        *puVar2 = uVar21;
        puVar2[1] = uVar22;
        puVar2[2] = uVar23;
        puVar2[3] = uVar24;
      }
      else {
        if (uVar6 < 0x41) {
          uVar21 = 0;
          uVar22 = 0;
          uVar23 = 0;
          uVar24 = 0;
          *(undefined8 *)((long)mem + 0x10) = 0;
          *(undefined8 *)((long)mem + 0x18) = 0;
          puVar3 = (undefined8 *)((long)mem + (uVar20 - 0x10));
          *puVar3 = 0;
          puVar3[1] = 0;
          goto LAB_002ca002;
        }
        if (0x50 < uVar6) {
          lVar16 = (long)mem + 0x50;
          uVar17 = 0x50;
          do {
            *(undefined8 *)(lVar16 + -0x10) = 0;
            *(undefined8 *)(lVar16 + -8) = 0;
            *(undefined8 *)(lVar16 + -0x20) = 0;
            *(undefined8 *)(lVar16 + -0x18) = 0;
            *(undefined8 *)(lVar16 + -0x30) = 0;
            *(undefined8 *)(lVar16 + -0x28) = 0;
            *(undefined8 *)(lVar16 + -0x40) = 0;
            *(undefined8 *)(lVar16 + -0x38) = 0;
            uVar17 = uVar17 + 0x40;
            lVar16 = lVar16 + 0x40;
          } while (uVar17 < uVar20);
        }
        uVar21 = 0;
        uVar22 = 0;
        uVar23 = 0;
        uVar24 = 0;
        puVar3 = (undefined8 *)((long)mem + (uVar20 - 0x10));
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)mem + (uVar20 - 0x20));
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)mem + (uVar20 - 0x30));
        *puVar3 = 0;
        puVar3[1] = 0;
LAB_002ca0cc:
        puVar2 = (undefined4 *)((long)mem + (uVar20 - 0x40));
        *puVar2 = uVar21;
        puVar2[1] = uVar22;
        puVar2[2] = uVar23;
        puVar2[3] = uVar24;
      }
    }
    else {
      if (TVar5 != kMemcpy) {
        PlacementNew<false,google::protobuf::MessageLite>();
        goto LAB_002ca174;
      }
      if (uVar6 < 0x21) {
        puVar2 = (undefined4 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar20);
        uVar21 = *puVar2;
        uVar22 = puVar2[1];
        uVar23 = puVar2[2];
        uVar24 = puVar2[3];
        goto LAB_002c9fbf;
      }
      if (0x40 < uVar6) {
        if (0x50 < uVar6) {
          lVar16 = (long)mem + 0x50;
          uVar17 = 0x50;
          do {
            puVar3 = (undefined8 *)((long)&prototype_for_copy[-4]._vptr_MessageLite + uVar17);
            uVar8 = *puVar3;
            uVar9 = puVar3[1];
            puVar3 = (undefined8 *)((long)&prototype_for_copy[-3]._vptr_MessageLite + uVar17);
            uVar10 = *puVar3;
            uVar11 = puVar3[1];
            puVar3 = (undefined8 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar17);
            uVar12 = *puVar3;
            uVar13 = puVar3[1];
            puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar17);
            uVar14 = puVar3[1];
            *(undefined8 *)(lVar16 + -0x10) = *puVar3;
            *(undefined8 *)(lVar16 + -8) = uVar14;
            *(undefined8 *)(lVar16 + -0x20) = uVar12;
            *(undefined8 *)(lVar16 + -0x18) = uVar13;
            *(undefined8 *)(lVar16 + -0x30) = uVar10;
            *(undefined8 *)(lVar16 + -0x28) = uVar11;
            *(undefined8 *)(lVar16 + -0x40) = uVar8;
            *(undefined8 *)(lVar16 + -0x38) = uVar9;
            uVar17 = uVar17 + 0x40;
            lVar16 = lVar16 + 0x40;
          } while (uVar17 < uVar20);
        }
        puVar2 = (undefined4 *)((long)&prototype_for_copy[-4]._vptr_MessageLite + uVar20);
        uVar21 = *puVar2;
        uVar22 = puVar2[1];
        uVar23 = puVar2[2];
        uVar24 = puVar2[3];
        puVar3 = (undefined8 *)((long)&prototype_for_copy[-3]._vptr_MessageLite + uVar20);
        uVar8 = *puVar3;
        uVar9 = puVar3[1];
        puVar3 = (undefined8 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar20);
        uVar10 = *puVar3;
        uVar11 = puVar3[1];
        puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar20);
        uVar12 = puVar3[1];
        puVar4 = (undefined8 *)((long)mem + (uVar20 - 0x10));
        *puVar4 = *puVar3;
        puVar4[1] = uVar12;
        puVar3 = (undefined8 *)((long)mem + (uVar20 - 0x20));
        *puVar3 = uVar10;
        puVar3[1] = uVar11;
        puVar3 = (undefined8 *)((long)mem + (uVar20 - 0x30));
        *puVar3 = uVar8;
        puVar3[1] = uVar9;
        goto LAB_002ca0cc;
      }
      iVar7 = prototype_for_copy[1]._internal_metadata_.ptr_;
      *(_func_int ***)((long)mem + 0x10) = prototype_for_copy[1]._vptr_MessageLite;
      *(intptr_t *)((long)mem + 0x18) = iVar7;
      puVar2 = (undefined4 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar20);
      uVar21 = *puVar2;
      uVar22 = puVar2[1];
      uVar23 = puVar2[2];
      uVar24 = puVar2[3];
      puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar20);
      uVar8 = puVar3[1];
      puVar4 = (undefined8 *)((long)mem + (uVar20 - 0x10));
      *puVar4 = *puVar3;
      puVar4[1] = uVar8;
LAB_002ca002:
      puVar2 = (undefined4 *)((long)mem + (uVar20 - 0x20));
      *puVar2 = uVar21;
      puVar2[1] = uVar22;
      puVar2[2] = uVar23;
      puVar2[3] = uVar24;
    }
    arena_bits(this);
    uVar17 = arena_bits(this);
    while( true ) {
      if (uVar17 == 0) {
        *(_func_int ***)mem = prototype_for_copy->_vptr_MessageLite;
        *(Arena **)((long)mem + 8) = arena;
        return (MessageLite *)mem;
      }
      lVar16 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
        }
      }
      uVar19 = (ulong)(uint)((int)lVar16 << 3);
      if (uVar20 < uVar19 + 8) break;
      if (*(long *)((long)mem + uVar19) != 0) goto LAB_002ca136;
      *(Arena **)((long)mem + uVar19) = arena;
      uVar17 = uVar17 & uVar17 - 1;
    }
    PlacementNew<false,google::protobuf::MessageLite>();
LAB_002ca136:
    PlacementNew<false,google::protobuf::MessageLite>();
    unaff_RBX = arena;
    unaff_R13 = this;
  }
  this = unaff_R13;
  arena = unaff_RBX;
  prototype_for_func = &local_40;
  PlacementNew<false,google::protobuf::MessageLite>();
LAB_002ca14d:
  pMVar18 = (MessageLite *)(*(this->field_3).func_)(prototype_for_func,mem,arena);
  return pMVar18;
}

Assistant:

PROTOBUF_ALWAYS_INLINE MessageLite* MessageCreator::PlacementNew(
    const MessageLite* prototype_for_func,
    const MessageLite* prototype_for_copy, void* mem, Arena* arena) const {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) % alignment_, 0u);
  const Tag as_tag = tag();
  // When the feature is not enabled we skip the `as_tag` check since it is
  // unnecessary. Except for testing, where we want to test the copy logic even
  // when we can't use it for real messages.
  constexpr bool kMustBeFunc = !test_call && !internal::EnableCustomNew();
  static_assert(kFunc < 0 && !(kZeroInit < 0) && !(kMemcpy < 0),
                "Only kFunc must be the only negative value");
  if (ABSL_PREDICT_FALSE(kMustBeFunc || (int8_t)as_tag < 0)) {
    PROTOBUF_DEBUG_COUNTER("MessageCreator.Func").Inc();
    return static_cast<MessageLite*>(func_(prototype_for_func, mem, arena));
  }

  char* dst = static_cast<char*>(mem);
  const size_t size = allocation_size_;
  const char* src = reinterpret_cast<const char*>(prototype_for_copy);

  // These are a bit more efficient than calling normal memset/memcpy because:
  //  - We know the minimum size is 16. We have a fallback for when it is not.
  //  - We can "underflow" the buffer because those are the MessageLite bytes
  //    we will set later.
  if (as_tag == kZeroInit) {
    // Make sure the input is really all zeros.
    ABSL_DCHECK(std::all_of(src + sizeof(MessageLite), src + size,
                            [](auto c) { return c == 0; }));

    if (sizeof(MessageLite) != 16) {
      memset(dst, 0, size);
    } else if (size <= 32) {
      memset(dst + size - 16, 0, 16);
    } else if (size <= 64) {
      memset(dst + 16, 0, 16);
      memset(dst + size - 32, 0, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memset(dst + offset, 0, 64);
      }
      memset(dst + size - 64, 0, 64);
    }
  } else {
    ABSL_DCHECK_EQ(+as_tag, +kMemcpy);

    if (sizeof(MessageLite) != 16) {
      memcpy(dst, src, size);
    } else if (size <= 32) {
      memcpy(dst + size - 16, src + size - 16, 16);
    } else if (size <= 64) {
      memcpy(dst + 16, src + 16, 16);
      memcpy(dst + size - 32, src + size - 32, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCache(src + offset + 64);
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memcpy(dst + offset, src + offset, 64);
      }
      memcpy(dst + size - 64, src + size - 64, 64);
    }
  }

  if (arena_bits() != 0) {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.ZeroArena").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.McpyArena").Inc();
    }
  } else {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Zero").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Mcpy").Inc();
    }
  }

  if (internal::PerformDebugChecks() || arena != nullptr) {
    if (uintptr_t offsets = arena_bits()) {
      do {
        const size_t offset = absl::countr_zero(offsets) * sizeof(Arena*);
        ABSL_DCHECK_LE(offset + sizeof(Arena*), size);
        // Verify we are overwriting a null pointer. If we are not, there is a
        // bug somewhere.
        ABSL_DCHECK_EQ(*reinterpret_cast<Arena**>(dst + offset), nullptr);
        memcpy(dst + offset, &arena, sizeof(arena));
        offsets &= offsets - 1;
      } while (offsets != 0);
    }
  }

  // The second memcpy overwrites part of the first, but the compiler should
  // avoid the double-write. It's easier than trying to avoid the overlap.
  memcpy(dst, static_cast<const void*>(prototype_for_copy),
         sizeof(MessageLite));
  memcpy(dst + PROTOBUF_FIELD_OFFSET(MessageLite, _internal_metadata_), &arena,
         sizeof(arena));
  return Launder(reinterpret_cast<MessageLite*>(mem));
}